

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O3

void __thiscall efsw::FileWatcherInotify::~FileWatcherInotify(FileWatcherInotify *this)

{
  Mutex *this_00;
  Mutex *this_01;
  Mutex *this_02;
  _Rb_tree_node_base *p_Var1;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherInotify_0012fc40;
  (this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i = false;
  while (this->mIsTakingAction == true) {
    usleep(1000);
  }
  this_00 = &this->mInitLock;
  Mutex::lock(this_00);
  if (this->mThread != (Thread *)0x0) {
    (*this->mThread->_vptr_Thread[1])();
    this->mThread = (Thread *)0x0;
  }
  this_01 = &this->mWatchesLock;
  Mutex::lock(this_01);
  this_02 = &this->mRealWatchesLock;
  Mutex::lock(this_02);
  for (p_Var1 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
      p_Var1[1]._M_parent = (_Base_ptr)0x0;
    }
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::clear(&(this->mWatches)._M_t);
  if (this->mFD != -1) {
    close(this->mFD);
    this->mFD = -1;
  }
  Mutex::unlock(this_02);
  Mutex::unlock(this_01);
  Mutex::unlock(this_00);
  std::
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->mMovedOutsideWatches);
  Mutex::~Mutex(this_00);
  Mutex::~Mutex(this_02);
  Mutex::~Mutex(this_01);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mWatchesRef)._M_h);
  std::
  _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~_Rb_tree(&(this->mRealWatches)._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~_Rb_tree(&(this->mWatches)._M_t);
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherInotify::~FileWatcherInotify() {
	mInitOK = false;
	// There is deadlock when release FileWatcherInotify instance since its handAction
	// function is still running and hangs in requiring lock without init lock captured.
	while ( mIsTakingAction ) {
		// It'd use condition-wait instead of sleep. Actually efsw has no such
		// implementation so we just skip and sleep while for that to avoid deadlock.
		usleep( 1000 );
	};
	Lock initLock( mInitLock );

	efSAFE_DELETE( mThread );

	Lock l( mWatchesLock );
	Lock l2( mRealWatchesLock );

	WatchMap::iterator iter = mWatches.begin();
	WatchMap::iterator end = mWatches.end();

	for ( ; iter != end; ++iter ) {
		efSAFE_DELETE( iter->second );
	}

	mWatches.clear();

	if ( mFD != -1 ) {
		close( mFD );
		mFD = -1;
	}
}